

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestRegistry.cpp
# Opt level: O0

void __thiscall TestRegistry::listTestGroupAndCaseNames(TestRegistry *this,TestResult *result)

{
  byte bVar1;
  char *pcVar2;
  long *in_RSI;
  long in_RDI;
  SimpleString groupAndName;
  UtestShell *test;
  SimpleString groupAndNameList;
  TestResult *in_stack_ffffffffffffff68;
  UtestShell *in_stack_ffffffffffffff70;
  TestRegistry *in_stack_ffffffffffffff78;
  SimpleString *in_stack_ffffffffffffff80;
  undefined7 in_stack_ffffffffffffff88;
  undefined1 in_stack_ffffffffffffff8f;
  SimpleString *in_stack_ffffffffffffff90;
  undefined6 in_stack_ffffffffffffff98;
  undefined1 in_stack_ffffffffffffff9e;
  undefined1 in_stack_ffffffffffffff9f;
  char *in_stack_ffffffffffffffc0;
  char *in_stack_ffffffffffffffc8;
  SimpleString *in_stack_ffffffffffffffd0;
  SimpleString *local_20;
  SimpleString local_18;
  long *local_10;
  
  local_10 = in_RSI;
  SimpleString::SimpleString
            ((SimpleString *)in_stack_ffffffffffffff70,(char *)in_stack_ffffffffffffff68);
  local_20 = *(SimpleString **)(in_RDI + 8);
  while (local_20 != (SimpleString *)0x0) {
    in_stack_ffffffffffffff9f =
         testShouldRun(in_stack_ffffffffffffff78,in_stack_ffffffffffffff70,in_stack_ffffffffffffff68
                      );
    if ((bool)in_stack_ffffffffffffff9f) {
      SimpleString::SimpleString
                ((SimpleString *)in_stack_ffffffffffffff70,(char *)in_stack_ffffffffffffff68);
      SimpleString::operator+=
                (in_stack_ffffffffffffff90,
                 (char *)CONCAT17(in_stack_ffffffffffffff8f,in_stack_ffffffffffffff88));
      UtestShell::getGroup((UtestShell *)in_stack_ffffffffffffff68);
      SimpleString::operator+=
                ((SimpleString *)in_stack_ffffffffffffff70,(SimpleString *)in_stack_ffffffffffffff68
                );
      SimpleString::~SimpleString((SimpleString *)0x21e3de);
      SimpleString::operator+=
                (in_stack_ffffffffffffff90,
                 (char *)CONCAT17(in_stack_ffffffffffffff8f,in_stack_ffffffffffffff88));
      UtestShell::getName((UtestShell *)in_stack_ffffffffffffff68);
      SimpleString::operator+=
                ((SimpleString *)in_stack_ffffffffffffff70,(SimpleString *)in_stack_ffffffffffffff68
                );
      SimpleString::~SimpleString((SimpleString *)0x21e41d);
      SimpleString::operator+=
                (in_stack_ffffffffffffff90,
                 (char *)CONCAT17(in_stack_ffffffffffffff8f,in_stack_ffffffffffffff88));
      in_stack_ffffffffffffff9e =
           SimpleString::contains
                     ((SimpleString *)in_stack_ffffffffffffff70,
                      (SimpleString *)in_stack_ffffffffffffff68);
      if (!(bool)in_stack_ffffffffffffff9e) {
        SimpleString::operator+=
                  ((SimpleString *)in_stack_ffffffffffffff70,
                   (SimpleString *)in_stack_ffffffffffffff68);
        SimpleString::operator+=
                  (in_stack_ffffffffffffff90,
                   (char *)CONCAT17(in_stack_ffffffffffffff8f,in_stack_ffffffffffffff88));
      }
      SimpleString::~SimpleString((SimpleString *)0x21e4e3);
    }
    in_stack_ffffffffffffff90 = (SimpleString *)(**(code **)(local_20->buffer_ + 0x18))();
    local_20 = in_stack_ffffffffffffff90;
  }
  SimpleString::replace
            (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0);
  SimpleString::SimpleString
            ((SimpleString *)in_stack_ffffffffffffff70,(char *)in_stack_ffffffffffffff68);
  bVar1 = SimpleString::endsWith
                    ((SimpleString *)CONCAT17(in_stack_ffffffffffffff8f,in_stack_ffffffffffffff88),
                     in_stack_ffffffffffffff80);
  SimpleString::~SimpleString((SimpleString *)0x21e56c);
  if ((bVar1 & 1) != 0) {
    SimpleString::size((SimpleString *)0x21e586);
    SimpleString::subString
              ((SimpleString *)
               CONCAT17(in_stack_ffffffffffffff9f,
                        CONCAT16(in_stack_ffffffffffffff9e,in_stack_ffffffffffffff98)),
               (size_t)in_stack_ffffffffffffff90,CONCAT17(bVar1,in_stack_ffffffffffffff88));
    SimpleString::operator=
              ((SimpleString *)in_stack_ffffffffffffff70,(SimpleString *)in_stack_ffffffffffffff68);
    SimpleString::~SimpleString((SimpleString *)0x21e5cb);
  }
  pcVar2 = SimpleString::asCharString(&local_18);
  (**(code **)(*local_10 + 0x70))(local_10,pcVar2);
  SimpleString::~SimpleString((SimpleString *)0x21e644);
  return;
}

Assistant:

void TestRegistry::listTestGroupAndCaseNames(TestResult& result)
{
    SimpleString groupAndNameList;

    for (UtestShell *test = tests_; test != NULL; test = test->getNext()) {
        if (testShouldRun(test, result)) {
            SimpleString groupAndName;
            groupAndName += "#";
            groupAndName += test->getGroup();
            groupAndName += ".";
            groupAndName += test->getName();
            groupAndName += "#";

            if (!groupAndNameList.contains(groupAndName)) {
                groupAndNameList += groupAndName;
                groupAndNameList += " ";
            }
        }
    }

    groupAndNameList.replace("#", "");

    if (groupAndNameList.endsWith(" "))
        groupAndNameList = groupAndNameList.subString(0, groupAndNameList.size() - 1);
    result.print(groupAndNameList.asCharString());
}